

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ValueRangeExpression::fromSyntax
          (Compilation *comp,ValueRangeExpressionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  ASTContext *pAVar2;
  bool bVar3;
  logic_t lVar4;
  Expression *pEVar5;
  Expression *args_3;
  ValueRangeExpression *expr;
  SourceLocation SVar6;
  Diagnostic *pDVar7;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  char cVar8;
  Type *this_00;
  Type *pTVar9;
  bitmask<slang::ast::ASTFlags> extraFlags;
  ValueRangeKind rangeKind;
  ConstantValue cvl;
  ConstantValue cvr;
  ValueRangeKind local_9c;
  Type *local_98;
  ASTContext *local_90;
  Type *local_88;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  char local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  TVar1 = (syntax->op).kind;
  if (TVar1 == PlusModMinus) {
    local_9c = RelativeTolerance;
  }
  else if (TVar1 == PlusDivMinus) {
    local_9c = AbsoluteTolerance;
  }
  else {
    local_9c = Simple;
  }
  extraFlags.m_bits = (ulong)(local_9c == Simple) << 9;
  pEVar5 = Expression::create(comp,(syntax->left).ptr,context,extraFlags,(Type *)0x0);
  local_90 = context;
  args_3 = Expression::create(comp,(syntax->right).ptr,context,extraFlags,(Type *)0x0);
  pTVar9 = comp->voidType;
  local_80._M_rest._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&comp->super_BumpAllocator,pTVar9,&local_9c,pEVar5,args_3,
                    (SourceRange *)&local_80);
  bVar3 = Expression::bad(pEVar5);
  if ((!bVar3) && (bVar3 = Expression::bad(args_3), !bVar3)) {
    pTVar9 = (pEVar5->type).ptr;
    local_98 = (args_3->type).ptr;
    if (local_9c == Simple) {
      if (pTVar9->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar9);
      }
      if ((pTVar9->canonical->super_Symbol).kind == UnboundedType) {
        pTVar9 = comp->intType;
        if (local_98->canonical == (Type *)0x0) {
          Type::resolveCanonical(local_98);
        }
        if ((local_98->canonical->super_Symbol).kind == UnboundedType) {
          ASTContext::addDiag(local_90,(DiagCode)0xa90007,(expr->super_Expression).sourceRange);
        }
      }
      if (local_98->canonical == (Type *)0x0) {
        Type::resolveCanonical(local_98);
      }
      this_00 = local_98;
      if ((local_98->canonical->super_Symbol).kind == UnboundedType) {
        this_00 = comp->intType;
      }
      local_88 = pTVar9;
      bVar3 = Type::isNumeric(pTVar9);
      if (((bVar3) && (bVar3 = Type::isNumeric(this_00), bVar3)) ||
         ((bVar3 = Expression::isImplicitString(pEVar5), bVar3 &&
          (bVar3 = Expression::isImplicitString(args_3), bVar3)))) {
        pAVar2 = local_90;
        ASTContext::tryEval((ConstantValue *)&local_80,local_90,pEVar5);
        ASTContext::tryEval((ConstantValue *)&local_58,pAVar2,args_3);
        if ((local_60 == '\x01') && (local_58._M_index == '\x01')) {
          this = std::
                 get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
          rhs = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)&local_58);
          lVar4 = SVInt::operator<=(this,rhs);
          cVar8 = lVar4.value == '\0';
          if (lVar4.value == '@') {
            cVar8 = -0x80;
          }
          if (lVar4.value == 0x80) {
            cVar8 = -0x80;
          }
          if (((cVar8 != '\0') && (cVar8 != -0x80)) && (cVar8 != '@')) {
            ASTContext::addDiag(local_90,(DiagCode)0xd20007,(expr->super_Expression).sourceRange);
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
        return &expr->super_Expression;
      }
      SVar6 = parsing::Token::location(&syntax->op);
      pDVar7 = ASTContext::addDiag(local_90,(DiagCode)0x330007,SVar6);
      pDVar7 = Diagnostic::operator<<(pDVar7,pEVar5->sourceRange);
      pDVar7 = Diagnostic::operator<<(pDVar7,args_3->sourceRange);
      pDVar7 = ast::operator<<(pDVar7,local_88);
    }
    else {
      local_88 = pTVar9;
      bVar3 = Type::isNumeric(pTVar9);
      pAVar2 = local_90;
      if ((bVar3) && (bVar3 = Type::isNumeric(local_98), bVar3)) {
        Expression::selfDetermined(pAVar2,&expr->right_);
        return &expr->super_Expression;
      }
      SVar6 = parsing::Token::location(&syntax->op);
      pDVar7 = ASTContext::addDiag(pAVar2,(DiagCode)0x330007,SVar6);
      pDVar7 = Diagnostic::operator<<(pDVar7,pEVar5->sourceRange);
      pDVar7 = Diagnostic::operator<<(pDVar7,args_3->sourceRange);
      pDVar7 = ast::operator<<(pDVar7,local_88);
      this_00 = local_98;
    }
    ast::operator<<(pDVar7,this_00);
  }
  pEVar5 = Expression::badExpr(comp,&expr->super_Expression);
  return pEVar5;
}

Assistant:

Expression& ValueRangeExpression::fromSyntax(Compilation& comp,
                                             const ValueRangeExpressionSyntax& syntax,
                                             const ASTContext& context) {
    ValueRangeKind rangeKind;
    switch (syntax.op.kind) {
        case TokenKind::PlusDivMinus:
            rangeKind = ValueRangeKind::AbsoluteTolerance;
            break;
        case TokenKind::PlusModMinus:
            rangeKind = ValueRangeKind::RelativeTolerance;
            break;
        default:
            rangeKind = ValueRangeKind::Simple;
            break;
    }

    // Unbounded literals are allowed if we are not a tolerance range.
    const auto flags = rangeKind == ValueRangeKind::Simple ? ASTFlags::AllowUnboundedLiteral
                                                           : ASTFlags::None;
    auto& left = create(comp, *syntax.left, context, flags);
    auto& right = create(comp, *syntax.right, context, flags);
    auto result = comp.emplace<ValueRangeExpression>(comp.getVoidType(), rangeKind, left, right,
                                                     syntax.sourceRange());
    if (left.bad() || right.bad())
        return badExpr(comp, result);

    auto lt = left.type;
    auto rt = right.type;

    if (rangeKind == ValueRangeKind::Simple) {
        if (lt->isUnbounded()) {
            lt = &comp.getIntType();
            if (rt->isUnbounded())
                context.addDiag(diag::ValueRangeUnbounded, result->sourceRange);
        }

        if (rt->isUnbounded())
            rt = &comp.getIntType();

        if (!(lt->isNumeric() && rt->isNumeric()) &&
            !(left.isImplicitString() && right.isImplicitString())) {
            auto& diag = context.addDiag(diag::BadValueRange, syntax.op.location());
            diag << left.sourceRange << right.sourceRange << *lt << *rt;
            return badExpr(comp, result);
        }

        auto cvl = context.tryEval(left);
        auto cvr = context.tryEval(right);
        if (cvl.isInteger() && cvr.isInteger() && bool(cvl.integer() > cvr.integer()))
            context.addDiag(diag::ReversedValueRange, result->sourceRange);
    }
    else {
        if (!lt->isNumeric() || !rt->isNumeric()) {
            auto& diag = context.addDiag(diag::BadValueRange, syntax.op.location());
            diag << left.sourceRange << right.sourceRange << *lt << *rt;
            return badExpr(comp, result);
        }

        selfDetermined(context, result->right_);
    }

    return *result;
}